

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void selectSource(atom *theAtoms,pattern *srcPat,int srcFlag,pattern *targPat,int targFlg,
                 pattern *ignorePat)

{
  int iVar1;
  atom *local_40;
  atom *src;
  pattern *ignorePat_local;
  int targFlg_local;
  pattern *targPat_local;
  int srcFlag_local;
  pattern *srcPat_local;
  atom *theAtoms_local;
  
  for (local_40 = theAtoms; local_40 != (atom *)0x0; local_40 = local_40->next) {
    if (((DoHet != 0) || ((local_40->props & 0x800U) == 0)) &&
       ((DoH2O != 0 || ((local_40->props & 0x400U) == 0)))) {
      if ((srcPat != (pattern *)0x0) && (iVar1 = matchPat(local_40,srcPat), iVar1 != 0)) {
        local_40->flags = srcFlag | local_40->flags;
      }
      if ((targPat != (pattern *)0x0) && (iVar1 = matchPat(local_40,targPat), iVar1 != 0)) {
        local_40->flags = targFlg | local_40->flags;
      }
      if ((ignorePat != (pattern *)0x0) && (iVar1 = matchPat(local_40,ignorePat), iVar1 != 0)) {
        local_40->flags = 4;
      }
    }
  }
  return;
}

Assistant:

void selectSource(atom *theAtoms, pattern *srcPat, int srcFlag,
		  pattern *targPat, int targFlg, pattern *ignorePat)
{
   atom *src = NULL;

   for(src = theAtoms; src; src = src->next)
   {
      if(   (DoHet || ! (src->props &   HET_PROP) )
         && (DoH2O || ! (src->props & WATER_PROP) ) )
      {
         /*060212 hets marked as prot,dna,rna could be excluded by these tests*/
         /* if src||target was specified as not-prot,dna,rna,... */
         /* seemingly because atoms of hets are also assigned those types */
	 if (srcPat && matchPat(src,  srcPat)) { src->flags |= srcFlag; }
	 if(targPat && matchPat(src, targPat)) { src->flags |= targFlg; }

	 /*if ((FABS(src->occ) <= OccupancyCutoff)        */
	 /*   || (ignorePat && matchPat(src, ignorePat))) */
         /*050119 not use occ cutoff here, so 0-occ atom will be put into bins*/
	 if (ignorePat && matchPat(src, ignorePat))
         {
	    src->flags = IGNORE_FLAG; /* overwrite any other settings */
            /*050118 this seems the only place that sets IGNORE_FLAG*/
	 }
      }
   }
}